

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_exponent_digit_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  error_category *peVar4;
  error_code err;
  
  iVar1 = (this->super_matcher<pstore::json::null_output>).state_;
  if (1 < iVar1 - 9U) {
    assert_failed("this->get_state () == exponent_digit_state || this->get_state () == exponent_initial_digit_state"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x2ab);
  }
  if ((this->super_matcher<pstore::json::null_output>).field_0xd != '\x01') {
    if ((byte)(c - 0x30U) < 10) {
      (this->fp_acc_).exponent = ((uint)(byte)c + (this->fp_acc_).exponent * 10) - 0x30;
      (this->super_matcher<pstore::json::null_output>).state_ = 10;
      bVar2 = true;
    }
    else if (iVar1 == 9) {
      peVar4 = get_error_category();
      err._M_cat = peVar4;
      err._0_8_ = 0xb;
      bVar3 = parser<pstore::json::null_output>::set_error(parser,err);
      bVar2 = true;
      if (bVar3) {
        (this->super_matcher<pstore::json::null_output>).state_ = 1;
      }
    }
    else {
      (this->super_matcher<pstore::json::null_output>).state_ = 1;
      make_result(this,parser);
      bVar2 = false;
    }
    return bVar2;
  }
  assert_failed("!is_integer_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x2ac);
}

Assistant:

bool number_matcher<Callbacks>::do_exponent_digit_state (parser<Callbacks> & parser,
                                                                     char const c) {
                PSTORE_ASSERT (this->get_state () == exponent_digit_state ||
                               this->get_state () == exponent_initial_digit_state);
                PSTORE_ASSERT (!is_integer_);

                bool match = true;
                if (c >= '0' && c <= '9') {
                    fp_acc_.exponent = fp_acc_.exponent * 10U + static_cast<unsigned> (c - '0');
                    this->set_state (exponent_digit_state);
                } else {
                    if (this->get_state () == exponent_initial_digit_state) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        match = false;
                        this->complete (parser);
                    }
                }
                return match;
            }